

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O2

void __thiscall Database::destroy_dataset(Database *this,string *dsname)

{
  __type_conflict2 _Var1;
  string *__lhs;
  iterator __position;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  string_view_t fmt;
  string local_50;
  
  __position._M_current =
       (this->loaded_datasets).
       super__Vector_base<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  do {
    while( true ) {
      if (__position._M_current ==
          (this->loaded_datasets).
          super__Vector_base<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        return;
      }
      __lhs = OnDiskDataset::get_name_abi_cxx11_
                        (((__position._M_current)->_M_t).
                         super___uniq_ptr_impl<OnDiskDataset,_std::default_delete<OnDiskDataset>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_OnDiskDataset_*,_std::default_delete<OnDiskDataset>_>
                         .super__Head_base<0UL,_OnDiskDataset_*,_false>._M_head_impl);
      _Var1 = std::operator==(__lhs,dsname);
      if (!_Var1) break;
LAB_0012047d:
      fmt.size_ = (size_t)dsname;
      fmt.data_ = (char *)0xb;
      spdlog::info<std::__cxx11::string>((spdlog *)"DESTROY: {}",fmt,in_RCX);
      OnDiskDataset::drop(((__position._M_current)->_M_t).
                          super___uniq_ptr_impl<OnDiskDataset,_std::default_delete<OnDiskDataset>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_OnDiskDataset_*,_std::default_delete<OnDiskDataset>_>
                          .super__Head_base<0UL,_OnDiskDataset_*,_false>._M_head_impl);
      __position = std::
                   vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
                   ::erase(&this->loaded_datasets,(const_iterator)__position._M_current);
    }
    OnDiskDataset::get_id_abi_cxx11_
              (&local_50,
               ((__position._M_current)->_M_t).
               super___uniq_ptr_impl<OnDiskDataset,_std::default_delete<OnDiskDataset>_>._M_t.
               super__Tuple_impl<0UL,_OnDiskDataset_*,_std::default_delete<OnDiskDataset>_>.
               super__Head_base<0UL,_OnDiskDataset_*,_false>._M_head_impl);
    _Var1 = std::operator==(&local_50,dsname);
    std::__cxx11::string::~string((string *)&local_50);
    if (_Var1) goto LAB_0012047d;
    __position._M_current = __position._M_current + 1;
  } while( true );
}

Assistant:

void Database::destroy_dataset(const std::string &dsname) {
    for (auto it = loaded_datasets.begin(); it != loaded_datasets.end();) {
        if ((*it)->get_name() == dsname || (*it)->get_id() == dsname) {
            spdlog::info("DESTROY: {}", dsname);
            (*it)->drop();
            it = loaded_datasets.erase(it);
        } else {
            ++it;
        }
    }
}